

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                 (UnknownFieldLiteParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  byte *ptr_00;
  long lVar4;
  byte *local_20;
  
  local_20 = (byte *)ptr;
  while( true ) {
    bVar2 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_20,ctx->group_depth_);
    if (bVar2) {
      return (char *)local_20;
    }
    bVar1 = *local_20;
    uVar3 = (uint)bVar1;
    ptr_00 = local_20 + 1;
    if ((char)bVar1 < '\0') {
      uVar3 = ((uint)bVar1 + (uint)*ptr_00 * 0x80) - 0x80;
      if ((char)*ptr_00 < '\0') {
        ptr_00 = local_20 + 3;
        lVar4 = -0x15;
        while (uVar3 = (ptr_00[-1] - 1 << ((char)lVar4 + 0x23U & 0x1f)) + uVar3,
              (char)ptr_00[-1] < '\0') {
          ptr_00 = ptr_00 + 1;
          lVar4 = lVar4 + 7;
          if (lVar4 == 0) {
            return (char *)0x0;
          }
        }
      }
      else {
        ptr_00 = local_20 + 2;
      }
    }
    if ((uVar3 == 0) || ((uVar3 & 7) == 4)) break;
    local_20 = ptr_00;
    local_20 = (byte *)FieldParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                                 ((ulong)uVar3,field_parser,(char *)ptr_00,ctx);
    if (local_20 == (byte *)0x0) {
      return (char *)0x0;
    }
  }
  (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar3 - 1;
  return (char *)ptr_00;
}

Assistant:

PROTOBUF_NODISCARD const char* WireFormatParser(T& field_parser,
                                                const char* ptr,
                                                ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}